

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_rsa.cc
# Opt level: O0

int pkey_rsa_decrypt(EVP_PKEY_CTX *ctx,uint8_t *out,size_t *outlen,uint8_t *in,size_t inlen)

{
  int iVar1;
  size_t local_58;
  size_t padded_len;
  size_t key_len;
  RSA *rsa;
  RSA_PKEY_CTX *rctx;
  size_t inlen_local;
  uint8_t *in_local;
  size_t *outlen_local;
  uint8_t *out_local;
  EVP_PKEY_CTX *ctx_local;
  
  rsa = (RSA *)ctx->data;
  key_len = (size_t)ctx->pkey->pkey;
  rctx = (RSA_PKEY_CTX *)inlen;
  inlen_local = (size_t)in;
  in_local = (uint8_t *)outlen;
  outlen_local = (size_t *)out;
  out_local = (uint8_t *)ctx;
  iVar1 = EVP_PKEY_size((EVP_PKEY *)ctx->pkey);
  padded_len = (size_t)iVar1;
  if (outlen_local == (size_t *)0x0) {
    *(size_t *)in_local = padded_len;
    ctx_local._4_4_ = 1;
  }
  else if (*(ulong *)in_local < padded_len) {
    ERR_put_error(6,0,100,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_rsa.cc"
                  ,0x137);
    ctx_local._4_4_ = 0;
  }
  else if (*(int *)&rsa->e == 4) {
    iVar1 = setup_tbuf((RSA_PKEY_CTX *)rsa,(EVP_PKEY_CTX *)out_local);
    if (((iVar1 != 0) &&
        (iVar1 = RSA_decrypt((RSA *)key_len,&local_58,(uint8_t *)rsa->dmp1,padded_len,
                             (uint8_t *)inlen_local,(size_t)rctx,3), iVar1 != 0)) &&
       (iVar1 = RSA_padding_check_PKCS1_OAEP_mgf1
                          ((uint8_t *)outlen_local,(size_t *)in_local,padded_len,
                           (uint8_t *)rsa->dmp1,local_58,(uint8_t *)rsa->dmq1,(size_t)rsa->iqmp,
                           (EVP_MD *)rsa->d,(EVP_MD *)rsa->p), iVar1 != 0)) {
      return 1;
    }
    ctx_local._4_4_ = 0;
  }
  else {
    ctx_local._4_4_ =
         RSA_decrypt((RSA *)key_len,(size_t *)in_local,(uint8_t *)outlen_local,padded_len,
                     (uint8_t *)inlen_local,(size_t)rctx,*(int *)&rsa->e);
  }
  return ctx_local._4_4_;
}

Assistant:

static int pkey_rsa_decrypt(EVP_PKEY_CTX *ctx, uint8_t *out, size_t *outlen,
                            const uint8_t *in, size_t inlen) {
  RSA_PKEY_CTX *rctx = reinterpret_cast<RSA_PKEY_CTX *>(ctx->data);
  RSA *rsa = reinterpret_cast<RSA *>(ctx->pkey->pkey);
  const size_t key_len = EVP_PKEY_size(ctx->pkey);

  if (!out) {
    *outlen = key_len;
    return 1;
  }

  if (*outlen < key_len) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_BUFFER_TOO_SMALL);
    return 0;
  }

  if (rctx->pad_mode == RSA_PKCS1_OAEP_PADDING) {
    size_t padded_len;
    if (!setup_tbuf(rctx, ctx) ||
        !RSA_decrypt(rsa, &padded_len, rctx->tbuf, key_len, in, inlen,
                     RSA_NO_PADDING) ||
        !RSA_padding_check_PKCS1_OAEP_mgf1(
            out, outlen, key_len, rctx->tbuf, padded_len, rctx->oaep_label,
            rctx->oaep_labellen, rctx->md, rctx->mgf1md)) {
      return 0;
    }
    return 1;
  }

  return RSA_decrypt(rsa, outlen, out, key_len, in, inlen, rctx->pad_mode);
}